

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O0

size_t __thiscall
raspicam::_private::Private_Impl::getImageTypeSize(Private_Impl *this,RASPICAM_FORMAT type)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int in_ESI;
  Private_Impl *in_RDI;
  undefined8 local_8;
  
  if (in_ESI == 0) {
    uVar3 = getWidth(in_RDI);
    uVar4 = getHeight(in_RDI);
    uVar1 = getWidth(in_RDI);
    uVar2 = getHeight(in_RDI);
    local_8 = (ulong)(uVar3 * uVar4 + ((uVar1 >> 1) * uVar2 & 0xfffffffe));
  }
  else if (in_ESI == 1) {
    uVar3 = getWidth(in_RDI);
    uVar4 = getHeight(in_RDI);
    local_8 = (ulong)(uVar3 * uVar4);
  }
  else if (in_ESI - 2U < 2) {
    uVar3 = getWidth(in_RDI);
    uVar4 = getHeight(in_RDI);
    local_8 = (ulong)(uVar3 * 3 * uVar4);
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_t Private_Impl::getImageTypeSize ( RASPICAM_FORMAT type ) const{
            switch ( type ) {
            case RASPICAM_FORMAT_YUV420:
                return getWidth() *getHeight() + 2* ( ( getWidth() /2 *getHeight() /2 ) );
                break;
            case RASPICAM_FORMAT_GRAY:
                return getWidth() *getHeight();
                break;
            case RASPICAM_FORMAT_BGR:
            case RASPICAM_FORMAT_RGB:
                return 3*getWidth() *getHeight();
                break;
            default:
                return 0;
            };
        }